

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  uint uVar1;
  ImGuiWindow *this;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *g;
  float fVar6;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  if (((GImGui->NavDisableMouseHover == true) && (((uint)flags >> 10 & 1) == 0)) &&
     (GImGui->NavDisableHighlight == false)) {
    if ((((uint)flags >> 9 & 1) != 0) || (((GImGui->LastItemData).InFlags & 4U) == 0)) {
      if (GImGui->NavId == 0) {
        return false;
      }
      if (GImGui->NavId != (GImGui->LastItemData).ID) {
        return false;
      }
LAB_001e491e:
      if (((uint)flags >> 0xb & 1) == 0) {
        fVar6 = 0.0;
        if (((uint)flags >> 0xc & 1) != 0) {
          fVar6 = (GImGui->IO).HoverDelayShort;
        }
      }
      else {
        fVar6 = (GImGui->IO).HoverDelayNormal;
      }
      if (0.0 < fVar6) {
        IVar4 = (GImGui->LastItemData).ID;
        if (IVar4 == 0) {
          IVar4 = ImGuiWindow::GetIDFromRectangle(this,&(GImGui->LastItemData).Rect);
        }
        if ((((uint)flags >> 0xd & 1) != 0) && (pIVar3->HoverDelayIdPreviousFrame != IVar4)) {
          pIVar3->HoverDelayTimer = 0.0;
        }
        pIVar3->HoverDelayId = IVar4;
        return fVar6 <= pIVar3->HoverDelayTimer;
      }
      return true;
    }
  }
  else {
    uVar1 = (GImGui->LastItemData).StatusFlags;
    if ((((uVar1 & 1) != 0) &&
        (((flags & 0x100U) != 0 || (uVar1 & 0x80) != 0 || (GImGui->HoveredWindow == this)))) &&
       (((char)flags < '\0' ||
        (((IVar4 = GImGui->ActiveId, IVar4 == 0 || (IVar4 == (GImGui->LastItemData).ID)) ||
         ((GImGui->ActiveIdAllowOverlap != false || (IVar4 == this->MoveId)))))))) {
      if ((((((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
             (pIVar2 = GImGui->NavWindow->RootWindow, pIVar2 != (ImGuiWindow *)0x0)) &&
            (pIVar2->WasActive == true)) && (pIVar5 = this->RootWindow, pIVar2 != pIVar5)) &&
          ((((uint)pIVar2->Flags >> 0x1b & 1) != 0 ||
           (((flags & 0x20U) == 0 && ((pIVar2->Flags & 0x4000000U) != 0)))))) &&
         (pIVar5->RootWindow != pIVar2)) {
        for (; pIVar5 != (ImGuiWindow *)0x0; pIVar5 = pIVar5->ParentWindowInBeginStack) {
          if (pIVar5 == pIVar2) goto LAB_001e48ed;
        }
        if (((GImGui->LastItemData).InFlags & 0x100) == 0) {
          return false;
        }
      }
LAB_001e48ed:
      if (((((uint)flags >> 9 & 1) != 0) || (((GImGui->LastItemData).InFlags & 4U) == 0)) &&
         (((GImGui->LastItemData).ID != this->MoveId || (this->WriteAccessed == false))))
      goto LAB_001e491e;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight && !(flags & ImGuiHoveredFlags_NoNavOverride))
    {
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;
        if (!IsItemFocused())
            return false;
    }
    else
    {
        // Test for bounding box overlap, as updated as ItemAdd()
        ImGuiItemStatusFlags status_flags = g.LastItemData.StatusFlags;
        if (!(status_flags & ImGuiItemStatusFlags_HoveredRect))
            return false;
        IM_ASSERT((flags & (ImGuiHoveredFlags_AnyWindow | ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows | ImGuiHoveredFlags_NoPopupHierarchy)) == 0);   // Flags not supported by this function

        // Done with rectangle culling so we can perform heavier checks now
        // Test if we are hovering the right window (our window could be behind another window)
        // [2021/03/02] Reworked / reverted the revert, finally. Note we want e.g. BeginGroup/ItemAdd/EndGroup to work as well. (#3851)
        // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable
        // to use IsItemHovered() after EndChild() itself. Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was
        // the test that has been running for a long while.
        if (g.HoveredWindow != window && (status_flags & ImGuiItemStatusFlags_HoveredWindow) == 0)
            if ((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0)
                return false;

        // Test if another item is active (e.g. being dragged)
        if ((flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem) == 0)
            if (g.ActiveId != 0 && g.ActiveId != g.LastItemData.ID && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
                return false;

        // Test if interactions on this window are blocked by an active popup or modal.
        // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
        if (!IsWindowContentHoverable(window, flags) && !(g.LastItemData.InFlags & ImGuiItemFlags_NoWindowHoverableCheck))
            return false;

        // Test if the item is disabled
        if ((g.LastItemData.InFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
            return false;

        // Special handling for calling after Begin() which represent the title bar or tab.
        // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
        if (g.LastItemData.ID == window->MoveId && window->WriteAccessed)
            return false;
    }

    // Handle hover delay
    // (some ideas: https://www.nngroup.com/articles/timing-exposing-content)
    float delay;
    if (flags & ImGuiHoveredFlags_DelayNormal)
        delay = g.IO.HoverDelayNormal;
    else if (flags & ImGuiHoveredFlags_DelayShort)
        delay = g.IO.HoverDelayShort;
    else
        delay = 0.0f;
    if (delay > 0.0f)
    {
        ImGuiID hover_delay_id = (g.LastItemData.ID != 0) ? g.LastItemData.ID : window->GetIDFromRectangle(g.LastItemData.Rect);
        if ((flags & ImGuiHoveredFlags_NoSharedDelay) && (g.HoverDelayIdPreviousFrame != hover_delay_id))
            g.HoverDelayTimer = 0.0f;
        g.HoverDelayId = hover_delay_id;
        return g.HoverDelayTimer >= delay;
    }

    return true;
}